

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O0

ValuedAction __thiscall
despot::DefaultPolicy::Value
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  DSPOMDP *pDVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference ppSVar5;
  undefined4 extraout_var;
  size_t sVar6;
  reference ppSVar7;
  ValuedAction VVar8;
  int local_70;
  int i_1;
  value_type local_60;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  DefaultPolicy *this_local;
  ValuedAction va;
  
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)history;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50);
  local_54 = 0;
  while( true ) {
    uVar3 = (ulong)local_54;
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar4 <= uVar3) break;
    pDVar1 = (this->super_ScenarioLowerBound).model_;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)local_54);
    iVar2 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,*ppSVar5);
    local_60 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50,&local_60);
    local_54 = local_54 + 1;
  }
  sVar6 = History::Size((History *)
                        copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  this->initial_depth_ = (int)sVar6;
  VVar8 = RecursiveValue(this,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50,
                         streams,(History *)
                                 copy.
                                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_70 = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50);
    if (sVar4 <= (ulong)(long)local_70) break;
    pDVar1 = (this->super_ScenarioLowerBound).model_;
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50,
                         (long)local_70);
    (*pDVar1->_vptr_DSPOMDP[0x17])(pDVar1,*ppSVar7);
    local_70 = local_70 + 1;
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_50);
  VVar8._4_4_ = 0;
  return VVar8;
}

Assistant:

ValuedAction DefaultPolicy::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(model_->Copy(particles[i]));

	initial_depth_ = history.Size();
	ValuedAction va = RecursiveValue(copy, streams, history);

	for (int i = 0; i < copy.size(); i++)
		model_->Free(copy[i]);

	return va;
}